

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O3

Vertex_handle __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
last_vertex(Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            *this)

{
  long lVar1;
  
  if ((this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lVar1 = std::_Rb_tree_decrement
                      (&(this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header);
    return (Vertex_handle)*(boost_vertex_handle *)(lVar1 + 0x20);
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker/Skeleton_blocker_simplex.h"
                ,0xdd,
                "T Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::last_vertex() const [T = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle]"
               );
}

Assistant:

T last_vertex() const {
    assert(!empty());
    return *(simplex_set.rbegin());
  }